

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::ComputeTargetManifest(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  cmGlobalGenerator *this_00;
  ulong uVar3;
  string local_130;
  undefined1 local_110 [8];
  string f;
  string dir;
  undefined1 local_c0 [8];
  string pdbName;
  string impName;
  string realName;
  string soName;
  string name;
  cmGlobalGenerator *gg;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    return;
  }
  this_00 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
  std::__cxx11::string::string((string *)(soName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(realName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(impName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(pdbName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_c0);
  TVar2 = GetType(this);
  if (TVar2 == EXECUTABLE) {
    GetExecutableNames(this,(string *)((long)&soName.field_2 + 8),
                       (string *)((long)&impName.field_2 + 8),(string *)((long)&pdbName.field_2 + 8)
                       ,(string *)local_c0,config);
  }
  else {
    TVar2 = GetType(this);
    if (((TVar2 != STATIC_LIBRARY) && (TVar2 = GetType(this), TVar2 != SHARED_LIBRARY)) &&
       (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) goto LAB_007fe0b9;
    GetLibraryNames(this,(string *)((long)&soName.field_2 + 8),
                    (string *)((long)&realName.field_2 + 8),(string *)((long)&impName.field_2 + 8),
                    (string *)((long)&pdbName.field_2 + 8),(string *)local_c0,config);
  }
  GetDirectory((string *)((long)&f.field_2 + 8),this,config,RuntimeBinaryArtifact);
  std::__cxx11::string::string((string *)local_110);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_110,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_110,"/");
    std::__cxx11::string::operator+=
              ((string *)local_110,(string *)(soName.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest(this_00,(string *)local_110);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_110,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_110,"/");
    std::__cxx11::string::operator+=
              ((string *)local_110,(string *)(realName.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest(this_00,(string *)local_110);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_110,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_110,"/");
    std::__cxx11::string::operator+=
              ((string *)local_110,(string *)(impName.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest(this_00,(string *)local_110);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_110,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_110,"/");
    std::__cxx11::string::operator+=((string *)local_110,(string *)local_c0);
    cmGlobalGenerator::AddToManifest(this_00,(string *)local_110);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    GetDirectory(&local_130,this,config,ImportLibraryArtifact);
    std::__cxx11::string::operator=((string *)local_110,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::operator+=((string *)local_110,"/");
    std::__cxx11::string::operator+=
              ((string *)local_110,(string *)(pdbName.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest(this_00,(string *)local_110);
  }
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)(f.field_2._M_local_buf + 8));
LAB_007fe0b9:
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)(pdbName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(impName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(realName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soName.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGeneratorTarget::ComputeTargetManifest(const std::string& config) const
{
  if (this->IsImported()) {
    return;
  }
  cmGlobalGenerator* gg = this->LocalGenerator->GetGlobalGenerator();

  // Get the names.
  std::string name;
  std::string soName;
  std::string realName;
  std::string impName;
  std::string pdbName;
  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    this->GetExecutableNames(name, realName, impName, pdbName, config);
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    this->GetLibraryNames(name, soName, realName, impName, pdbName, config);
  } else {
    return;
  }

  // Get the directory.
  std::string dir =
    this->GetDirectory(config, cmStateEnums::RuntimeBinaryArtifact);

  // Add each name.
  std::string f;
  if (!name.empty()) {
    f = dir;
    f += "/";
    f += name;
    gg->AddToManifest(f);
  }
  if (!soName.empty()) {
    f = dir;
    f += "/";
    f += soName;
    gg->AddToManifest(f);
  }
  if (!realName.empty()) {
    f = dir;
    f += "/";
    f += realName;
    gg->AddToManifest(f);
  }
  if (!pdbName.empty()) {
    f = dir;
    f += "/";
    f += pdbName;
    gg->AddToManifest(f);
  }
  if (!impName.empty()) {
    f = this->GetDirectory(config, cmStateEnums::ImportLibraryArtifact);
    f += "/";
    f += impName;
    gg->AddToManifest(f);
  }
}